

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.h
# Opt level: O0

Simplex * __thiscall
Gudhi::skeleton_blocker::
Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
::simplex(Simplex *__return_storage_ptr__,
         Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
         *this)

{
  Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *this_local;
  Simplex *res;
  
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<>(__return_storage_ptr__);
  add_vertices_up_to_the_root(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Simplex simplex() const {
    Simplex res;
    add_vertices_up_to_the_root(res);
    return res;
  }